

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_vulkan.c
# Opt level: O1

int gladLoadVulkanUserPtr(VkPhysicalDevice physical_device,GLADuserptrloadfunc load,void *userptr)

{
  VkResult VVar1;
  uint uVar2;
  VkExtensionProperties *pVVar3;
  VkExtensionProperties *__ptr;
  size_t sVar4;
  void *pvVar5;
  undefined4 uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint32_t uVar12;
  uint32_t instance_extension_count;
  uint32_t device_extension_count;
  uint32_t version;
  uint32_t local_39c;
  int local_398;
  uint32_t local_394;
  VkExtensionProperties *local_390;
  ulong local_388;
  ulong local_380;
  ulong local_378;
  VkPhysicalDevice local_370;
  VkPhysicalDeviceProperties local_368;
  
  glad_vkEnumerateInstanceVersion =
       (PFN_vkEnumerateInstanceVersion)(*load)("vkEnumerateInstanceVersion",userptr);
  if (glad_vkEnumerateInstanceVersion == (PFN_vkEnumerateInstanceVersion)0x0) {
    uVar10 = 0;
    uVar2 = 1;
  }
  else {
    VVar1 = (*glad_vkEnumerateInstanceVersion)(&local_368.apiVersion);
    uVar10 = 0;
    if (VVar1 == VK_SUCCESS) {
      uVar10 = (ulong)(local_368.apiVersion >> 0xc) & 0xffffffff000003ff;
    }
    uVar2 = 1;
    if (VVar1 == VK_SUCCESS) {
      uVar2 = local_368.apiVersion >> 0x16;
    }
  }
  if (glad_vkGetPhysicalDeviceProperties != (PFN_vkGetPhysicalDeviceProperties)0x0 &&
      physical_device != (VkPhysicalDevice)0x0) {
    (*glad_vkGetPhysicalDeviceProperties)(physical_device,&local_368);
    uVar2 = local_368.apiVersion >> 0x16;
    uVar10 = (ulong)(local_368.apiVersion >> 0xc & 0x3ff);
  }
  GLAD_VK_VERSION_1_0 = (int)(1 < uVar2);
  if (uVar2 == 1) {
    GLAD_VK_VERSION_1_0 = 1;
  }
  GLAD_VK_VERSION_1_1 = (uint)(1 < uVar2);
  if ((int)uVar10 != 0) {
    GLAD_VK_VERSION_1_1 = GLAD_VK_VERSION_1_0;
  }
  iVar11 = uVar2 * 10000 + (int)uVar10;
  if (iVar11 == 0) {
    return 0;
  }
  if (GLAD_VK_VERSION_1_0 != 0) {
    glad_vkAllocateCommandBuffers =
         (PFN_vkAllocateCommandBuffers)(*load)("vkAllocateCommandBuffers",userptr);
    glad_vkAllocateDescriptorSets =
         (PFN_vkAllocateDescriptorSets)(*load)("vkAllocateDescriptorSets",userptr);
    glad_vkAllocateMemory = (PFN_vkAllocateMemory)(*load)("vkAllocateMemory",userptr);
    glad_vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)(*load)("vkBeginCommandBuffer",userptr);
    glad_vkBindBufferMemory = (PFN_vkBindBufferMemory)(*load)("vkBindBufferMemory",userptr);
    glad_vkBindImageMemory = (PFN_vkBindImageMemory)(*load)("vkBindImageMemory",userptr);
    glad_vkCmdBeginQuery = (PFN_vkCmdBeginQuery)(*load)("vkCmdBeginQuery",userptr);
    glad_vkCmdBeginRenderPass = (PFN_vkCmdBeginRenderPass)(*load)("vkCmdBeginRenderPass",userptr);
    glad_vkCmdBindDescriptorSets =
         (PFN_vkCmdBindDescriptorSets)(*load)("vkCmdBindDescriptorSets",userptr);
    glad_vkCmdBindIndexBuffer = (PFN_vkCmdBindIndexBuffer)(*load)("vkCmdBindIndexBuffer",userptr);
    glad_vkCmdBindPipeline = (PFN_vkCmdBindPipeline)(*load)("vkCmdBindPipeline",userptr);
    glad_vkCmdBindVertexBuffers =
         (PFN_vkCmdBindVertexBuffers)(*load)("vkCmdBindVertexBuffers",userptr);
    glad_vkCmdBlitImage = (PFN_vkCmdBlitImage)(*load)("vkCmdBlitImage",userptr);
    glad_vkCmdClearAttachments = (PFN_vkCmdClearAttachments)(*load)("vkCmdClearAttachments",userptr)
    ;
    glad_vkCmdClearColorImage = (PFN_vkCmdClearColorImage)(*load)("vkCmdClearColorImage",userptr);
    glad_vkCmdClearDepthStencilImage =
         (PFN_vkCmdClearDepthStencilImage)(*load)("vkCmdClearDepthStencilImage",userptr);
    glad_vkCmdCopyBuffer = (PFN_vkCmdCopyBuffer)(*load)("vkCmdCopyBuffer",userptr);
    glad_vkCmdCopyBufferToImage =
         (PFN_vkCmdCopyBufferToImage)(*load)("vkCmdCopyBufferToImage",userptr);
    glad_vkCmdCopyImage = (PFN_vkCmdCopyImage)(*load)("vkCmdCopyImage",userptr);
    glad_vkCmdCopyImageToBuffer =
         (PFN_vkCmdCopyImageToBuffer)(*load)("vkCmdCopyImageToBuffer",userptr);
    glad_vkCmdCopyQueryPoolResults =
         (PFN_vkCmdCopyQueryPoolResults)(*load)("vkCmdCopyQueryPoolResults",userptr);
    glad_vkCmdDispatch = (PFN_vkCmdDispatch)(*load)("vkCmdDispatch",userptr);
    glad_vkCmdDispatchIndirect = (PFN_vkCmdDispatchIndirect)(*load)("vkCmdDispatchIndirect",userptr)
    ;
    glad_vkCmdDraw = (PFN_vkCmdDraw)(*load)("vkCmdDraw",userptr);
    glad_vkCmdDrawIndexed = (PFN_vkCmdDrawIndexed)(*load)("vkCmdDrawIndexed",userptr);
    glad_vkCmdDrawIndexedIndirect =
         (PFN_vkCmdDrawIndexedIndirect)(*load)("vkCmdDrawIndexedIndirect",userptr);
    glad_vkCmdDrawIndirect = (PFN_vkCmdDrawIndirect)(*load)("vkCmdDrawIndirect",userptr);
    glad_vkCmdEndQuery = (PFN_vkCmdEndQuery)(*load)("vkCmdEndQuery",userptr);
    glad_vkCmdEndRenderPass = (PFN_vkCmdEndRenderPass)(*load)("vkCmdEndRenderPass",userptr);
    glad_vkCmdExecuteCommands = (PFN_vkCmdExecuteCommands)(*load)("vkCmdExecuteCommands",userptr);
    glad_vkCmdFillBuffer = (PFN_vkCmdFillBuffer)(*load)("vkCmdFillBuffer",userptr);
    glad_vkCmdNextSubpass = (PFN_vkCmdNextSubpass)(*load)("vkCmdNextSubpass",userptr);
    glad_vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)(*load)("vkCmdPipelineBarrier",userptr);
    glad_vkCmdPushConstants = (PFN_vkCmdPushConstants)(*load)("vkCmdPushConstants",userptr);
    glad_vkCmdResetEvent = (PFN_vkCmdResetEvent)(*load)("vkCmdResetEvent",userptr);
    glad_vkCmdResetQueryPool = (PFN_vkCmdResetQueryPool)(*load)("vkCmdResetQueryPool",userptr);
    glad_vkCmdResolveImage = (PFN_vkCmdResolveImage)(*load)("vkCmdResolveImage",userptr);
    glad_vkCmdSetBlendConstants =
         (PFN_vkCmdSetBlendConstants)(*load)("vkCmdSetBlendConstants",userptr);
    glad_vkCmdSetDepthBias = (PFN_vkCmdSetDepthBias)(*load)("vkCmdSetDepthBias",userptr);
    glad_vkCmdSetDepthBounds = (PFN_vkCmdSetDepthBounds)(*load)("vkCmdSetDepthBounds",userptr);
    glad_vkCmdSetEvent = (PFN_vkCmdSetEvent)(*load)("vkCmdSetEvent",userptr);
    glad_vkCmdSetLineWidth = (PFN_vkCmdSetLineWidth)(*load)("vkCmdSetLineWidth",userptr);
    glad_vkCmdSetScissor = (PFN_vkCmdSetScissor)(*load)("vkCmdSetScissor",userptr);
    glad_vkCmdSetStencilCompareMask =
         (PFN_vkCmdSetStencilCompareMask)(*load)("vkCmdSetStencilCompareMask",userptr);
    glad_vkCmdSetStencilReference =
         (PFN_vkCmdSetStencilReference)(*load)("vkCmdSetStencilReference",userptr);
    glad_vkCmdSetStencilWriteMask =
         (PFN_vkCmdSetStencilWriteMask)(*load)("vkCmdSetStencilWriteMask",userptr);
    glad_vkCmdSetViewport = (PFN_vkCmdSetViewport)(*load)("vkCmdSetViewport",userptr);
    glad_vkCmdUpdateBuffer = (PFN_vkCmdUpdateBuffer)(*load)("vkCmdUpdateBuffer",userptr);
    glad_vkCmdWaitEvents = (PFN_vkCmdWaitEvents)(*load)("vkCmdWaitEvents",userptr);
    glad_vkCmdWriteTimestamp = (PFN_vkCmdWriteTimestamp)(*load)("vkCmdWriteTimestamp",userptr);
    glad_vkCreateBuffer = (PFN_vkCreateBuffer)(*load)("vkCreateBuffer",userptr);
    glad_vkCreateBufferView = (PFN_vkCreateBufferView)(*load)("vkCreateBufferView",userptr);
    glad_vkCreateCommandPool = (PFN_vkCreateCommandPool)(*load)("vkCreateCommandPool",userptr);
    glad_vkCreateComputePipelines =
         (PFN_vkCreateComputePipelines)(*load)("vkCreateComputePipelines",userptr);
    glad_vkCreateDescriptorPool =
         (PFN_vkCreateDescriptorPool)(*load)("vkCreateDescriptorPool",userptr);
    glad_vkCreateDescriptorSetLayout =
         (PFN_vkCreateDescriptorSetLayout)(*load)("vkCreateDescriptorSetLayout",userptr);
    glad_vkCreateDevice = (PFN_vkCreateDevice)(*load)("vkCreateDevice",userptr);
    glad_vkCreateEvent = (PFN_vkCreateEvent)(*load)("vkCreateEvent",userptr);
    glad_vkCreateFence = (PFN_vkCreateFence)(*load)("vkCreateFence",userptr);
    glad_vkCreateFramebuffer = (PFN_vkCreateFramebuffer)(*load)("vkCreateFramebuffer",userptr);
    glad_vkCreateGraphicsPipelines =
         (PFN_vkCreateGraphicsPipelines)(*load)("vkCreateGraphicsPipelines",userptr);
    glad_vkCreateImage = (PFN_vkCreateImage)(*load)("vkCreateImage",userptr);
    glad_vkCreateImageView = (PFN_vkCreateImageView)(*load)("vkCreateImageView",userptr);
    glad_vkCreateInstance = (PFN_vkCreateInstance)(*load)("vkCreateInstance",userptr);
    glad_vkCreatePipelineCache = (PFN_vkCreatePipelineCache)(*load)("vkCreatePipelineCache",userptr)
    ;
    glad_vkCreatePipelineLayout =
         (PFN_vkCreatePipelineLayout)(*load)("vkCreatePipelineLayout",userptr);
    glad_vkCreateQueryPool = (PFN_vkCreateQueryPool)(*load)("vkCreateQueryPool",userptr);
    glad_vkCreateRenderPass = (PFN_vkCreateRenderPass)(*load)("vkCreateRenderPass",userptr);
    glad_vkCreateSampler = (PFN_vkCreateSampler)(*load)("vkCreateSampler",userptr);
    glad_vkCreateSemaphore = (PFN_vkCreateSemaphore)(*load)("vkCreateSemaphore",userptr);
    glad_vkCreateShaderModule = (PFN_vkCreateShaderModule)(*load)("vkCreateShaderModule",userptr);
    glad_vkDestroyBuffer = (PFN_vkDestroyBuffer)(*load)("vkDestroyBuffer",userptr);
    glad_vkDestroyBufferView = (PFN_vkDestroyBufferView)(*load)("vkDestroyBufferView",userptr);
    glad_vkDestroyCommandPool = (PFN_vkDestroyCommandPool)(*load)("vkDestroyCommandPool",userptr);
    glad_vkDestroyDescriptorPool =
         (PFN_vkDestroyDescriptorPool)(*load)("vkDestroyDescriptorPool",userptr);
    glad_vkDestroyDescriptorSetLayout =
         (PFN_vkDestroyDescriptorSetLayout)(*load)("vkDestroyDescriptorSetLayout",userptr);
    glad_vkDestroyDevice = (PFN_vkDestroyDevice)(*load)("vkDestroyDevice",userptr);
    glad_vkDestroyEvent = (PFN_vkDestroyEvent)(*load)("vkDestroyEvent",userptr);
    glad_vkDestroyFence = (PFN_vkDestroyFence)(*load)("vkDestroyFence",userptr);
    glad_vkDestroyFramebuffer = (PFN_vkDestroyFramebuffer)(*load)("vkDestroyFramebuffer",userptr);
    glad_vkDestroyImage = (PFN_vkDestroyImage)(*load)("vkDestroyImage",userptr);
    glad_vkDestroyImageView = (PFN_vkDestroyImageView)(*load)("vkDestroyImageView",userptr);
    glad_vkDestroyInstance = (PFN_vkDestroyInstance)(*load)("vkDestroyInstance",userptr);
    glad_vkDestroyPipeline = (PFN_vkDestroyPipeline)(*load)("vkDestroyPipeline",userptr);
    glad_vkDestroyPipelineCache =
         (PFN_vkDestroyPipelineCache)(*load)("vkDestroyPipelineCache",userptr);
    glad_vkDestroyPipelineLayout =
         (PFN_vkDestroyPipelineLayout)(*load)("vkDestroyPipelineLayout",userptr);
    glad_vkDestroyQueryPool = (PFN_vkDestroyQueryPool)(*load)("vkDestroyQueryPool",userptr);
    glad_vkDestroyRenderPass = (PFN_vkDestroyRenderPass)(*load)("vkDestroyRenderPass",userptr);
    glad_vkDestroySampler = (PFN_vkDestroySampler)(*load)("vkDestroySampler",userptr);
    glad_vkDestroySemaphore = (PFN_vkDestroySemaphore)(*load)("vkDestroySemaphore",userptr);
    glad_vkDestroyShaderModule = (PFN_vkDestroyShaderModule)(*load)("vkDestroyShaderModule",userptr)
    ;
    glad_vkDeviceWaitIdle = (PFN_vkDeviceWaitIdle)(*load)("vkDeviceWaitIdle",userptr);
    glad_vkEndCommandBuffer = (PFN_vkEndCommandBuffer)(*load)("vkEndCommandBuffer",userptr);
    glad_vkEnumerateDeviceExtensionProperties =
         (PFN_vkEnumerateDeviceExtensionProperties)
         (*load)("vkEnumerateDeviceExtensionProperties",userptr);
    glad_vkEnumerateDeviceLayerProperties =
         (PFN_vkEnumerateDeviceLayerProperties)(*load)("vkEnumerateDeviceLayerProperties",userptr);
    glad_vkEnumerateInstanceExtensionProperties =
         (PFN_vkEnumerateInstanceExtensionProperties)
         (*load)("vkEnumerateInstanceExtensionProperties",userptr);
    glad_vkEnumerateInstanceLayerProperties =
         (PFN_vkEnumerateInstanceLayerProperties)
         (*load)("vkEnumerateInstanceLayerProperties",userptr);
    glad_vkEnumeratePhysicalDevices =
         (PFN_vkEnumeratePhysicalDevices)(*load)("vkEnumeratePhysicalDevices",userptr);
    glad_vkFlushMappedMemoryRanges =
         (PFN_vkFlushMappedMemoryRanges)(*load)("vkFlushMappedMemoryRanges",userptr);
    glad_vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)(*load)("vkFreeCommandBuffers",userptr);
    glad_vkFreeDescriptorSets = (PFN_vkFreeDescriptorSets)(*load)("vkFreeDescriptorSets",userptr);
    glad_vkFreeMemory = (PFN_vkFreeMemory)(*load)("vkFreeMemory",userptr);
    glad_vkGetBufferMemoryRequirements =
         (PFN_vkGetBufferMemoryRequirements)(*load)("vkGetBufferMemoryRequirements",userptr);
    glad_vkGetDeviceMemoryCommitment =
         (PFN_vkGetDeviceMemoryCommitment)(*load)("vkGetDeviceMemoryCommitment",userptr);
    glad_vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)(*load)("vkGetDeviceProcAddr",userptr);
    glad_vkGetDeviceQueue = (PFN_vkGetDeviceQueue)(*load)("vkGetDeviceQueue",userptr);
    glad_vkGetEventStatus = (PFN_vkGetEventStatus)(*load)("vkGetEventStatus",userptr);
    glad_vkGetFenceStatus = (PFN_vkGetFenceStatus)(*load)("vkGetFenceStatus",userptr);
    glad_vkGetImageMemoryRequirements =
         (PFN_vkGetImageMemoryRequirements)(*load)("vkGetImageMemoryRequirements",userptr);
    glad_vkGetImageSparseMemoryRequirements =
         (PFN_vkGetImageSparseMemoryRequirements)
         (*load)("vkGetImageSparseMemoryRequirements",userptr);
    glad_vkGetImageSubresourceLayout =
         (PFN_vkGetImageSubresourceLayout)(*load)("vkGetImageSubresourceLayout",userptr);
    glad_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)(*load)("vkGetInstanceProcAddr",userptr)
    ;
    glad_vkGetPhysicalDeviceFeatures =
         (PFN_vkGetPhysicalDeviceFeatures)(*load)("vkGetPhysicalDeviceFeatures",userptr);
    glad_vkGetPhysicalDeviceFormatProperties =
         (PFN_vkGetPhysicalDeviceFormatProperties)
         (*load)("vkGetPhysicalDeviceFormatProperties",userptr);
    glad_vkGetPhysicalDeviceImageFormatProperties =
         (PFN_vkGetPhysicalDeviceImageFormatProperties)
         (*load)("vkGetPhysicalDeviceImageFormatProperties",userptr);
    glad_vkGetPhysicalDeviceMemoryProperties =
         (PFN_vkGetPhysicalDeviceMemoryProperties)
         (*load)("vkGetPhysicalDeviceMemoryProperties",userptr);
    glad_vkGetPhysicalDeviceProperties =
         (PFN_vkGetPhysicalDeviceProperties)(*load)("vkGetPhysicalDeviceProperties",userptr);
    glad_vkGetPhysicalDeviceQueueFamilyProperties =
         (PFN_vkGetPhysicalDeviceQueueFamilyProperties)
         (*load)("vkGetPhysicalDeviceQueueFamilyProperties",userptr);
    glad_vkGetPhysicalDeviceSparseImageFormatProperties =
         (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)
         (*load)("vkGetPhysicalDeviceSparseImageFormatProperties",userptr);
    glad_vkGetPipelineCacheData =
         (PFN_vkGetPipelineCacheData)(*load)("vkGetPipelineCacheData",userptr);
    glad_vkGetQueryPoolResults = (PFN_vkGetQueryPoolResults)(*load)("vkGetQueryPoolResults",userptr)
    ;
    glad_vkGetRenderAreaGranularity =
         (PFN_vkGetRenderAreaGranularity)(*load)("vkGetRenderAreaGranularity",userptr);
    glad_vkInvalidateMappedMemoryRanges =
         (PFN_vkInvalidateMappedMemoryRanges)(*load)("vkInvalidateMappedMemoryRanges",userptr);
    glad_vkMapMemory = (PFN_vkMapMemory)(*load)("vkMapMemory",userptr);
    glad_vkMergePipelineCaches = (PFN_vkMergePipelineCaches)(*load)("vkMergePipelineCaches",userptr)
    ;
    glad_vkQueueBindSparse = (PFN_vkQueueBindSparse)(*load)("vkQueueBindSparse",userptr);
    glad_vkQueueSubmit = (PFN_vkQueueSubmit)(*load)("vkQueueSubmit",userptr);
    glad_vkQueueWaitIdle = (PFN_vkQueueWaitIdle)(*load)("vkQueueWaitIdle",userptr);
    glad_vkResetCommandBuffer = (PFN_vkResetCommandBuffer)(*load)("vkResetCommandBuffer",userptr);
    glad_vkResetCommandPool = (PFN_vkResetCommandPool)(*load)("vkResetCommandPool",userptr);
    glad_vkResetDescriptorPool = (PFN_vkResetDescriptorPool)(*load)("vkResetDescriptorPool",userptr)
    ;
    glad_vkResetEvent = (PFN_vkResetEvent)(*load)("vkResetEvent",userptr);
    glad_vkResetFences = (PFN_vkResetFences)(*load)("vkResetFences",userptr);
    glad_vkSetEvent = (PFN_vkSetEvent)(*load)("vkSetEvent",userptr);
    glad_vkUnmapMemory = (PFN_vkUnmapMemory)(*load)("vkUnmapMemory",userptr);
    glad_vkUpdateDescriptorSets =
         (PFN_vkUpdateDescriptorSets)(*load)("vkUpdateDescriptorSets",userptr);
    glad_vkWaitForFences = (PFN_vkWaitForFences)(*load)("vkWaitForFences",userptr);
  }
  if (GLAD_VK_VERSION_1_1 != 0) {
    glad_vkBindBufferMemory2 = (PFN_vkBindBufferMemory2)(*load)("vkBindBufferMemory2",userptr);
    glad_vkBindImageMemory2 = (PFN_vkBindImageMemory2)(*load)("vkBindImageMemory2",userptr);
    glad_vkCmdDispatchBase = (PFN_vkCmdDispatchBase)(*load)("vkCmdDispatchBase",userptr);
    glad_vkCmdSetDeviceMask = (PFN_vkCmdSetDeviceMask)(*load)("vkCmdSetDeviceMask",userptr);
    glad_vkCreateDescriptorUpdateTemplate =
         (PFN_vkCreateDescriptorUpdateTemplate)(*load)("vkCreateDescriptorUpdateTemplate",userptr);
    glad_vkCreateSamplerYcbcrConversion =
         (PFN_vkCreateSamplerYcbcrConversion)(*load)("vkCreateSamplerYcbcrConversion",userptr);
    glad_vkDestroyDescriptorUpdateTemplate =
         (PFN_vkDestroyDescriptorUpdateTemplate)(*load)("vkDestroyDescriptorUpdateTemplate",userptr)
    ;
    glad_vkDestroySamplerYcbcrConversion =
         (PFN_vkDestroySamplerYcbcrConversion)(*load)("vkDestroySamplerYcbcrConversion",userptr);
    glad_vkEnumerateInstanceVersion =
         (PFN_vkEnumerateInstanceVersion)(*load)("vkEnumerateInstanceVersion",userptr);
    glad_vkEnumeratePhysicalDeviceGroups =
         (PFN_vkEnumeratePhysicalDeviceGroups)(*load)("vkEnumeratePhysicalDeviceGroups",userptr);
    glad_vkGetBufferMemoryRequirements2 =
         (PFN_vkGetBufferMemoryRequirements2)(*load)("vkGetBufferMemoryRequirements2",userptr);
    glad_vkGetDescriptorSetLayoutSupport =
         (PFN_vkGetDescriptorSetLayoutSupport)(*load)("vkGetDescriptorSetLayoutSupport",userptr);
    glad_vkGetDeviceGroupPeerMemoryFeatures =
         (PFN_vkGetDeviceGroupPeerMemoryFeatures)
         (*load)("vkGetDeviceGroupPeerMemoryFeatures",userptr);
    glad_vkGetDeviceQueue2 = (PFN_vkGetDeviceQueue2)(*load)("vkGetDeviceQueue2",userptr);
    glad_vkGetImageMemoryRequirements2 =
         (PFN_vkGetImageMemoryRequirements2)(*load)("vkGetImageMemoryRequirements2",userptr);
    glad_vkGetImageSparseMemoryRequirements2 =
         (PFN_vkGetImageSparseMemoryRequirements2)
         (*load)("vkGetImageSparseMemoryRequirements2",userptr);
    glad_vkGetPhysicalDeviceExternalBufferProperties =
         (PFN_vkGetPhysicalDeviceExternalBufferProperties)
         (*load)("vkGetPhysicalDeviceExternalBufferProperties",userptr);
    glad_vkGetPhysicalDeviceExternalFenceProperties =
         (PFN_vkGetPhysicalDeviceExternalFenceProperties)
         (*load)("vkGetPhysicalDeviceExternalFenceProperties",userptr);
    glad_vkGetPhysicalDeviceExternalSemaphoreProperties =
         (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)
         (*load)("vkGetPhysicalDeviceExternalSemaphoreProperties",userptr);
    glad_vkGetPhysicalDeviceFeatures2 =
         (PFN_vkGetPhysicalDeviceFeatures2)(*load)("vkGetPhysicalDeviceFeatures2",userptr);
    glad_vkGetPhysicalDeviceFormatProperties2 =
         (PFN_vkGetPhysicalDeviceFormatProperties2)
         (*load)("vkGetPhysicalDeviceFormatProperties2",userptr);
    glad_vkGetPhysicalDeviceImageFormatProperties2 =
         (PFN_vkGetPhysicalDeviceImageFormatProperties2)
         (*load)("vkGetPhysicalDeviceImageFormatProperties2",userptr);
    glad_vkGetPhysicalDeviceMemoryProperties2 =
         (PFN_vkGetPhysicalDeviceMemoryProperties2)
         (*load)("vkGetPhysicalDeviceMemoryProperties2",userptr);
    glad_vkGetPhysicalDeviceProperties2 =
         (PFN_vkGetPhysicalDeviceProperties2)(*load)("vkGetPhysicalDeviceProperties2",userptr);
    glad_vkGetPhysicalDeviceQueueFamilyProperties2 =
         (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)
         (*load)("vkGetPhysicalDeviceQueueFamilyProperties2",userptr);
    glad_vkGetPhysicalDeviceSparseImageFormatProperties2 =
         (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)
         (*load)("vkGetPhysicalDeviceSparseImageFormatProperties2",userptr);
    glad_vkTrimCommandPool = (PFN_vkTrimCommandPool)(*load)("vkTrimCommandPool",userptr);
    glad_vkUpdateDescriptorSetWithTemplate =
         (PFN_vkUpdateDescriptorSetWithTemplate)(*load)("vkUpdateDescriptorSetWithTemplate",userptr)
    ;
  }
  local_39c = 0;
  local_394 = 0;
  lVar7 = CONCAT71((int7)(uVar10 >> 8),1);
  uVar6 = (undefined4)lVar7;
  if ((glad_vkEnumerateInstanceExtensionProperties ==
       (PFN_vkEnumerateInstanceExtensionProperties)0x0) ||
     ((physical_device != (VkPhysicalDevice)0x0 &&
      (glad_vkEnumerateDeviceExtensionProperties == (PFN_vkEnumerateDeviceExtensionProperties)0x0)))
     ) {
    uVar10 = 0;
    __ptr = (VkExtensionProperties *)0x0;
    goto LAB_00111fd4;
  }
  VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,&local_39c,(VkExtensionProperties *)0x0);
  if (VVar1 == VK_SUCCESS) {
    if (physical_device != (VkPhysicalDevice)0x0) {
      lVar7 = 0;
      VVar1 = (*glad_vkEnumerateDeviceExtensionProperties)
                        (physical_device,(char *)0x0,&local_394,(VkExtensionProperties *)0x0);
      if (VVar1 != VK_SUCCESS) goto LAB_00111fd2;
    }
    uVar12 = local_39c;
    local_380 = (ulong)local_394;
    uVar10 = local_380;
    if (local_394 < local_39c) {
      uVar10 = (ulong)local_39c;
    }
    lVar7 = uVar10 * 0x100;
    pVVar3 = (VkExtensionProperties *)malloc(uVar10 * 0x104);
    if (pVVar3 != (VkExtensionProperties *)0x0) {
      __ptr = (VkExtensionProperties *)0x0;
      local_390 = pVVar3;
      VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)((char *)0x0,&local_39c,pVVar3);
      local_388 = CONCAT44(local_388._4_4_,(int)CONCAT71((int7)((ulong)lVar7 >> 8),1));
      if (VVar1 == VK_SUCCESS) {
        uVar2 = (int)local_380 + uVar12;
        local_380 = (ulong)uVar2;
        __ptr = (VkExtensionProperties *)calloc((ulong)uVar2,8);
        if (__ptr == (VkExtensionProperties *)0x0) {
          uVar10 = 0;
          __ptr = (VkExtensionProperties *)0x0;
          pVVar3 = local_390;
        }
        else {
          local_398 = iVar11;
          local_370 = physical_device;
          if ((ulong)local_39c != 0) {
            uVar10 = 0;
            pVVar3 = local_390;
            local_378 = (ulong)local_39c;
            do {
              memcpy(&local_368,pVVar3,0x104);
              sVar4 = strlen((char *)&local_368);
              pvVar5 = malloc(sVar4 + 1);
              *(void **)(__ptr->extensionName + uVar10 * 8) = pvVar5;
              memcpy(pvVar5,&local_368,sVar4 + 1);
              uVar10 = uVar10 + 1;
              pVVar3 = pVVar3 + 1;
            } while (local_378 != uVar10);
          }
          if (local_370 == (VkPhysicalDevice)0x0) {
            local_388 = local_388 & 0xffffffff00000000;
            pVVar3 = local_390;
            uVar10 = local_380;
            iVar11 = local_398;
          }
          else {
            VVar1 = (*glad_vkEnumerateDeviceExtensionProperties)
                              (local_370,(char *)0x0,&local_394,local_390);
            uVar10 = local_380;
            iVar11 = local_398;
            if (VVar1 == VK_SUCCESS) {
              if ((ulong)local_394 == 0) {
                local_388 = local_388 & 0xffffffff00000000;
                pVVar3 = local_390;
              }
              else {
                local_378 = (ulong)local_394 * 0x104;
                uVar9 = 0;
                uVar12 = local_39c;
                do {
                  memcpy(&local_368,local_390->extensionName + uVar9,0x104);
                  local_388 = strlen((char *)&local_368);
                  local_388 = local_388 + 1;
                  pvVar5 = malloc(local_388);
                  *(void **)(__ptr->extensionName + (ulong)uVar12 * 8) = pvVar5;
                  memcpy(pvVar5,&local_368,local_388);
                  uVar9 = uVar9 + 0x104;
                  uVar12 = uVar12 + 1;
                } while (local_378 != uVar9);
                local_388 = local_388 & 0xffffffff00000000;
                pVVar3 = local_390;
                iVar11 = local_398;
              }
            }
            else {
              pVVar3 = __ptr;
              if (local_39c == 0) {
                uVar10 = 0;
                __ptr = (VkExtensionProperties *)0x0;
              }
              else {
                uVar10 = 0;
                do {
                  free(*(void **)(__ptr->extensionName + uVar10 * 8));
                  uVar10 = uVar10 + 1;
                } while (uVar10 < local_39c);
                uVar10 = 0;
                __ptr = (VkExtensionProperties *)0x0;
                iVar11 = local_398;
              }
            }
          }
        }
      }
      else {
        uVar10 = 0;
        pVVar3 = local_390;
      }
      free(pVVar3);
      uVar6 = (undefined4)local_388;
      goto LAB_00111fd4;
    }
  }
LAB_00111fd2:
  __ptr = (VkExtensionProperties *)0x0;
  uVar10 = 0;
  uVar6 = (undefined4)CONCAT71((int7)((ulong)lVar7 >> 8),1);
LAB_00111fd4:
  iVar8 = 0;
  if ((char)uVar6 == '\0') {
    local_388 = CONCAT44(local_388._4_4_,uVar6);
    uVar9 = uVar10 & 0xffffffff;
    local_398 = iVar11;
    local_380 = uVar10;
    if ((int)uVar10 == 0) {
      GLAD_VK_EXT_debug_report = 0;
      GLAD_VK_KHR_surface = 0;
    }
    else {
      uVar10 = 0;
      do {
        iVar11 = strcmp("VK_EXT_debug_report",*(char **)(__ptr->extensionName + uVar10 * 8));
        if (iVar11 == 0) {
          GLAD_VK_EXT_debug_report = 1;
          goto LAB_0011202c;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      GLAD_VK_EXT_debug_report = 0;
LAB_0011202c:
      uVar10 = 0;
      do {
        iVar11 = strcmp("VK_KHR_surface",*(char **)(__ptr->extensionName + uVar10 * 8));
        if (iVar11 == 0) {
          GLAD_VK_KHR_surface = 1;
          goto LAB_00112063;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      GLAD_VK_KHR_surface = 0;
    }
LAB_00112063:
    if ((int)local_380 == 0) {
      GLAD_VK_KHR_swapchain = 0;
    }
    else {
      uVar10 = 0;
      do {
        iVar11 = strcmp("VK_KHR_swapchain",*(char **)(__ptr->extensionName + uVar10 * 8));
        if (iVar11 == 0) {
          GLAD_VK_KHR_swapchain = 1;
          goto LAB_001120a6;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      GLAD_VK_KHR_swapchain = 0;
LAB_001120a6:
      if ((int)local_380 != 0) {
        uVar10 = 0;
        do {
          free(*(void **)(__ptr->extensionName + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    free(__ptr);
    iVar8 = 0;
    if ((char)local_388 == '\0') {
      if (GLAD_VK_EXT_debug_report != 0) {
        glad_vkCreateDebugReportCallbackEXT =
             (PFN_vkCreateDebugReportCallbackEXT)(*load)("vkCreateDebugReportCallbackEXT",userptr);
        glad_vkDebugReportMessageEXT =
             (PFN_vkDebugReportMessageEXT)(*load)("vkDebugReportMessageEXT",userptr);
        glad_vkDestroyDebugReportCallbackEXT =
             (PFN_vkDestroyDebugReportCallbackEXT)(*load)("vkDestroyDebugReportCallbackEXT",userptr)
        ;
      }
      iVar8 = local_398;
      if (GLAD_VK_KHR_surface != 0) {
        glad_vkDestroySurfaceKHR = (PFN_vkDestroySurfaceKHR)(*load)("vkDestroySurfaceKHR",userptr);
        glad_vkGetPhysicalDeviceSurfaceCapabilitiesKHR =
             (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
             (*load)("vkGetPhysicalDeviceSurfaceCapabilitiesKHR",userptr);
        glad_vkGetPhysicalDeviceSurfaceFormatsKHR =
             (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)
             (*load)("vkGetPhysicalDeviceSurfaceFormatsKHR",userptr);
        glad_vkGetPhysicalDeviceSurfacePresentModesKHR =
             (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)
             (*load)("vkGetPhysicalDeviceSurfacePresentModesKHR",userptr);
        glad_vkGetPhysicalDeviceSurfaceSupportKHR =
             (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)
             (*load)("vkGetPhysicalDeviceSurfaceSupportKHR",userptr);
      }
      if (GLAD_VK_KHR_swapchain != 0) {
        glad_vkAcquireNextImage2KHR =
             (PFN_vkAcquireNextImage2KHR)(*load)("vkAcquireNextImage2KHR",userptr);
        glad_vkAcquireNextImageKHR =
             (PFN_vkAcquireNextImageKHR)(*load)("vkAcquireNextImageKHR",userptr);
        glad_vkCreateSwapchainKHR =
             (PFN_vkCreateSwapchainKHR)(*load)("vkCreateSwapchainKHR",userptr);
        glad_vkDestroySwapchainKHR =
             (PFN_vkDestroySwapchainKHR)(*load)("vkDestroySwapchainKHR",userptr);
        glad_vkGetDeviceGroupPresentCapabilitiesKHR =
             (PFN_vkGetDeviceGroupPresentCapabilitiesKHR)
             (*load)("vkGetDeviceGroupPresentCapabilitiesKHR",userptr);
        glad_vkGetDeviceGroupSurfacePresentModesKHR =
             (PFN_vkGetDeviceGroupSurfacePresentModesKHR)
             (*load)("vkGetDeviceGroupSurfacePresentModesKHR",userptr);
        glad_vkGetPhysicalDevicePresentRectanglesKHR =
             (PFN_vkGetPhysicalDevicePresentRectanglesKHR)
             (*load)("vkGetPhysicalDevicePresentRectanglesKHR",userptr);
        glad_vkGetSwapchainImagesKHR =
             (PFN_vkGetSwapchainImagesKHR)(*load)("vkGetSwapchainImagesKHR",userptr);
        glad_vkQueuePresentKHR = (PFN_vkQueuePresentKHR)(*load)("vkQueuePresentKHR",userptr);
      }
    }
  }
  return iVar8;
}

Assistant:

int gladLoadVulkanUserPtr( VkPhysicalDevice physical_device, GLADuserptrloadfunc load, void *userptr) {
    int version;

#ifdef VK_VERSION_1_1
    vkEnumerateInstanceVersion  = (PFN_vkEnumerateInstanceVersion) load("vkEnumerateInstanceVersion", userptr);
#endif
    version = glad_vk_find_core_vulkan( physical_device);
    if (!version) {
        return 0;
    }

    glad_vk_load_VK_VERSION_1_0(load, userptr);
    glad_vk_load_VK_VERSION_1_1(load, userptr);

    if (!glad_vk_find_extensions_vulkan( physical_device)) return 0;
    glad_vk_load_VK_EXT_debug_report(load, userptr);
    glad_vk_load_VK_KHR_surface(load, userptr);
    glad_vk_load_VK_KHR_swapchain(load, userptr);


    return version;
}